

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_range_t * gravity_range_deserialize(gravity_vm *vm,json_value *json)

{
  uint uVar1;
  char *__s;
  long lVar2;
  int iVar3;
  size_t n_00;
  gravity_range_t *pgVar4;
  size_t label_size;
  json_value *value;
  char *label;
  uint32_t i;
  uint32_t n;
  int64_t to;
  int64_t from;
  json_value *json_local;
  gravity_vm *vm_local;
  
  to = 0;
  _i = 0;
  uVar1 = (json->u).string.length;
  label._0_4_ = 1;
  do {
    if (uVar1 <= (uint)label) {
      pgVar4 = gravity_range_new(vm,to,_i,true);
      return pgVar4;
    }
    __s = *(char **)((json->u).string.ptr + (ulong)(uint)label * 0x18);
    lVar2 = *(long *)((json->u).string.ptr + (ulong)(uint)label * 0x18 + 0x10);
    n_00 = strlen(__s);
    iVar3 = string_casencmp(__s,"from",n_00);
    if (iVar3 == 0) {
      if (*(int *)(lVar2 + 8) != 3) {
        return (gravity_range_t *)0x0;
      }
      to = *(int64_t *)(lVar2 + 0x10);
    }
    else {
      iVar3 = string_casencmp(__s,"to",n_00);
      if (iVar3 == 0) {
        if (*(int *)(lVar2 + 8) != 3) {
          return (gravity_range_t *)0x0;
        }
        _i = *(gravity_int_t *)(lVar2 + 0x10);
      }
    }
    label._0_4_ = (uint)label + 1;
  } while( true );
}

Assistant:

gravity_range_t *gravity_range_deserialize (gravity_vm *vm, json_value *json) {
    json_int_t from = 0;
    json_int_t to = 0;
    
    uint32_t n = json->u.object.length;
    for (uint32_t i=1; i<n; ++i) { // from 1 to skip type
        const char *label = json->u.object.values[i].name;
        json_value *value = json->u.object.values[i].value;
        size_t label_size = strlen(label);
        
        // from
        if (string_casencmp(label, GRAVITY_JSON_LABELFROM, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            from = value->u.integer;
            continue;
        }
        
        // to
        if (string_casencmp(label, GRAVITY_JSON_LABELTO, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            to = value->u.integer;
            continue;
        }
    }
    
    return gravity_range_new(vm, (gravity_int_t)from, (gravity_int_t)to, true);
    
abort_load:
    return NULL;
}